

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_h264e_vepu540c.c
# Opt level: O1

MPP_RET hal_h264e_vepu540c_start(void *hal,HalEncTask *task)

{
  MPP_RET MVar1;
  MPP_RET MVar2;
  char *fmt;
  MppDevRegWrCfg wr_cfg;
  MppDevRegRdCfg rd_cfg;
  long local_40 [3];
  undefined8 local_28;
  
  if (((byte)hal_h264e_debug & 2) != 0) {
    _mpp_log_l(4,"hal_h264e_vepu540c","enter %p\n","hal_h264e_vepu540c_start",hal);
  }
  local_40[0] = *(long *)((long)hal + 0x160);
  local_40[1] = 100;
  MVar1 = mpp_dev_ioctl(*(MppDev *)((long)hal + 8),4,local_40);
  if (MVar1 == MPP_OK) {
    local_40[0] = *(long *)((long)hal + 0x160) + 100;
    local_40[1] = 0x27000000214;
    MVar1 = mpp_dev_ioctl(*(MppDev *)((long)hal + 8),4,local_40);
    if (MVar1 != MPP_OK) goto LAB_0022937e;
    local_40[0] = *(long *)((long)hal + 0x160) + 0x278;
    local_40[1] = 0x100000000110;
    MVar1 = mpp_dev_ioctl(*(MppDev *)((long)hal + 8),4,local_40);
    if (MVar1 != MPP_OK) goto LAB_0022937e;
    local_40[0] = *(long *)((long)hal + 0x160) + 0x388;
    local_40[1] = 0x1700000002d0;
    MVar1 = mpp_dev_ioctl(*(MppDev *)((long)hal + 8),4,local_40);
    if (MVar1 != MPP_OK) goto LAB_0022937e;
    local_40[0] = *(long *)((long)hal + 0x160) + 0x658;
    local_40[1] = 0x200000000100;
    MVar1 = mpp_dev_ioctl(*(MppDev *)((long)hal + 8),4,local_40);
    if (MVar1 != MPP_OK) goto LAB_0022937e;
    local_40[0] = *(long *)((long)hal + 0x160) + 0x758;
    local_40[1] = 0x21e000000aa0;
    MVar1 = mpp_dev_ioctl(*(MppDev *)((long)hal + 8),4,local_40);
    if (MVar1 != MPP_OK) goto LAB_0022937e;
    local_40[2] = *(long *)((long)hal + 0x160) + 0x1378;
    local_28 = 0x400000000250;
    MVar1 = mpp_dev_ioctl(*(MppDev *)((long)hal + 8),5,local_40 + 2);
    if (MVar1 == MPP_OK) {
      MVar2 = mpp_dev_ioctl(*(MppDev *)((long)hal + 8),0xf,(void *)0x0);
      MVar1 = MPP_OK;
      if (MVar2 != MPP_OK) {
        _mpp_log_l(2,"hal_h264e_vepu540c","send cmd failed %d\n","hal_h264e_vepu540c_start",
                   (ulong)(uint)MVar2);
        MVar1 = MVar2;
      }
      goto LAB_002293a5;
    }
    fmt = "set register read failed %d\n";
  }
  else {
LAB_0022937e:
    fmt = "set register write failed %d\n";
  }
  _mpp_log_l(2,"hal_h264e_vepu540c",fmt,"hal_h264e_vepu540c_start",(ulong)(uint)MVar1);
LAB_002293a5:
  if (((byte)hal_h264e_debug & 2) != 0) {
    _mpp_log_l(4,"hal_h264e_vepu540c","leave %p\n","hal_h264e_vepu540c_start",hal);
  }
  return MVar1;
}

Assistant:

static MPP_RET hal_h264e_vepu540c_start(void *hal, HalEncTask *task)
{
    MPP_RET ret = MPP_OK;
    HalH264eVepu540cCtx *ctx = (HalH264eVepu540cCtx *)hal;

    (void) task;

    hal_h264e_dbg_func("enter %p\n", hal);

    do {
        MppDevRegWrCfg wr_cfg;
        MppDevRegRdCfg rd_cfg;

        wr_cfg.reg = &ctx->regs_set->reg_ctl;
        wr_cfg.size = sizeof(ctx->regs_set->reg_ctl);
        wr_cfg.offset = VEPU540C_CTL_OFFSET;
#if DUMP_REG
        {
            RK_U32 i;
            RK_U32 *reg = (RK_U32)wr_cfg.reg;
            for ( i = 0; i < sizeof(ctx->regs_set->reg_ctl) / sizeof(RK_U32); i++) {
                /* code */
                mpp_log("reg[%d] = 0x%08x\n", i, reg[i]);
            }

        }
#endif
        ret = mpp_dev_ioctl(ctx->dev, MPP_DEV_REG_WR, &wr_cfg);
        if (ret) {
            mpp_err_f("set register write failed %d\n", ret);
            break;
        }
        wr_cfg.reg = &ctx->regs_set->reg_base;
        wr_cfg.size = sizeof(ctx->regs_set->reg_base);
        wr_cfg.offset = VEPU540C_BASE_OFFSET;

        ret = mpp_dev_ioctl(ctx->dev, MPP_DEV_REG_WR, &wr_cfg);
        if (ret) {
            mpp_err_f("set register write failed %d\n", ret);
            break;
        }
        wr_cfg.reg = &ctx->regs_set->reg_rc_roi;
        wr_cfg.size = sizeof(ctx->regs_set->reg_rc_roi);
        wr_cfg.offset = VEPU540C_RCROI_OFFSET;

        ret = mpp_dev_ioctl(ctx->dev, MPP_DEV_REG_WR, &wr_cfg);
        if (ret) {
            mpp_err_f("set register write failed %d\n", ret);
            break;
        }
        wr_cfg.reg = &ctx->regs_set->reg_s3;
        wr_cfg.size = sizeof(ctx->regs_set->reg_s3);
        wr_cfg.offset = VEPU540C_WEG_OFFSET;

        ret = mpp_dev_ioctl(ctx->dev, MPP_DEV_REG_WR, &wr_cfg);
        if (ret) {
            mpp_err_f("set register write failed %d\n", ret);
            break;
        }
        wr_cfg.reg = &ctx->regs_set->reg_rdo;
        wr_cfg.size = sizeof(ctx->regs_set->reg_rdo);
        wr_cfg.offset = VEPU540C_RDOCFG_OFFSET;

        ret = mpp_dev_ioctl(ctx->dev, MPP_DEV_REG_WR, &wr_cfg);
        if (ret) {
            mpp_err_f("set register write failed %d\n", ret);
            break;
        }

        wr_cfg.reg = &ctx->regs_set->reg_scl;
        wr_cfg.size = sizeof(ctx->regs_set->reg_scl);
        wr_cfg.offset = VEPU540C_SCLCFG_OFFSET;

        ret = mpp_dev_ioctl(ctx->dev, MPP_DEV_REG_WR, &wr_cfg);
        if (ret) {
            mpp_err_f("set register write failed %d\n", ret);
            break;
        }

        rd_cfg.reg = &ctx->regs_set->reg_st;
        rd_cfg.size = sizeof(ctx->regs_set->reg_st);
        rd_cfg.offset = VEPU540C_STATUS_OFFSET;

        ret = mpp_dev_ioctl(ctx->dev, MPP_DEV_REG_RD, &rd_cfg);
        if (ret) {
            mpp_err_f("set register read failed %d\n", ret);
            break;
        }
        /* send request to hardware */
        ret = mpp_dev_ioctl(ctx->dev, MPP_DEV_CMD_SEND, NULL);

        if (ret) {
            mpp_err_f("send cmd failed %d\n", ret);
            break;
        }
    } while (0);

    hal_h264e_dbg_func("leave %p\n", hal);

    return ret;
}